

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

void lyd_free_attr(ly_ctx *ctx,lyd_node *parent,lyd_attr *attr,int recursive)

{
  lys_type *plVar1;
  undefined8 *puVar2;
  lys_type **type;
  lyd_attr *iter;
  int recursive_local;
  lyd_attr *attr_local;
  lyd_node *parent_local;
  ly_ctx *ctx_local;
  
  if ((ctx != (ly_ctx *)0x0) && (attr != (lyd_attr *)0x0)) {
    if (parent != (lyd_node *)0x0) {
      if (parent->attr == attr) {
        if (recursive == 0) {
          parent->attr = attr->next;
        }
        else {
          parent->attr = (lyd_attr *)0x0;
        }
      }
      else {
        for (type = (lys_type **)parent->attr; type[1] != (lys_type *)attr;
            type = (lys_type **)type[1]) {
        }
        if (type[1] != (lys_type *)0x0) {
          if (recursive == 0) {
            type[1] = (lys_type *)attr->next;
          }
          else {
            type[1] = (lys_type *)0x0;
          }
        }
      }
    }
    type = (lys_type **)attr;
    if (recursive == 0) {
      attr->next = (lyd_attr *)0x0;
    }
    while (type != (lys_type **)0x0) {
      plVar1 = type[1];
      lydict_remove(ctx,(char *)type[3]);
      puVar2 = (undefined8 *)
               lys_ext_complex_get_substmt
                         (LY_STMT_TYPE,(lys_ext_instance_complex *)type[2],(lyext_substmt **)0x0);
      if (puVar2 == (undefined8 *)0x0) {
        __assert_fail("type",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                      ,0x176b,
                      "void lyd_free_attr(struct ly_ctx *, struct lyd_node *, struct lyd_attr *, int)"
                     );
      }
      lyd_free_value(*(lyd_val *)(type + 5),*(LY_DATA_TYPE *)(type + 6),
                     *(uint8_t *)((long)type + 0x34),(lys_type *)*puVar2,(char *)type[4],
                     (lyd_val *)0x0,(LY_DATA_TYPE *)0x0,(uint8_t *)0x0);
      lydict_remove(ctx,(char *)type[4]);
      free(type);
      type = (lys_type **)plVar1;
    }
  }
  return;
}

Assistant:

API void
lyd_free_attr(struct ly_ctx *ctx, struct lyd_node *parent, struct lyd_attr *attr, int recursive)
{
    struct lyd_attr *iter;
    struct lys_type **type;

    if (!ctx || !attr) {
        return;
    }

    if (parent) {
        if (parent->attr == attr) {
            if (recursive) {
                parent->attr = NULL;
            } else {
                parent->attr = attr->next;
            }
        } else {
            for (iter = parent->attr; iter->next != attr; iter = iter->next);
            if (iter->next) {
                if (recursive) {
                    iter->next = NULL;
                } else {
                    iter->next = attr->next;
                }
            }
        }
    }

    if (!recursive) {
        attr->next = NULL;
    }

    for(iter = attr; iter; ) {
        attr = iter;
        iter = iter->next;

        lydict_remove(ctx, attr->name);
        type = lys_ext_complex_get_substmt(LY_STMT_TYPE, attr->annotation, NULL);
        assert(type);
        lyd_free_value(attr->value, attr->value_type, attr->value_flags, *type, attr->value_str, NULL, NULL, NULL);
        lydict_remove(ctx, attr->value_str);
        free(attr);
    }
}